

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void init_encode_frame_mb_context(AV1_COMP *cpi)

{
  int ss_x;
  AV1_COMMON *cm_00;
  int num_planes_00;
  long in_RDI;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  BLOCK_SIZE in_stack_00000013;
  int num_planes;
  AV1_COMMON *cm;
  MACROBLOCK *in_stack_00000028;
  int in_stack_ffffffffffffffe8;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  ss_x = av1_num_planes(cm_00);
  num_planes_00 = (int)((ulong)(in_RDI + 0x15030) >> 0x20);
  av1_setup_src_planes
            (in_stack_00000028,(YV12_BUFFER_CONFIG *)cpi,cm._4_4_,(int)cm,num_planes,
             in_stack_00000013);
  av1_setup_block_planes((MACROBLOCKD *)cm_00,ss_x,in_stack_ffffffffffffffe8,num_planes_00);
  return;
}

Assistant:

static inline void init_encode_frame_mb_context(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &cpi->td.mb;
  MACROBLOCKD *const xd = &x->e_mbd;

  // Copy data over into macro block data structures.
  av1_setup_src_planes(x, cpi->source, 0, 0, num_planes,
                       cm->seq_params->sb_size);

  av1_setup_block_planes(xd, cm->seq_params->subsampling_x,
                         cm->seq_params->subsampling_y, num_planes);
}